

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pipeline.hpp
# Opt level: O0

void __thiscall
tf::
DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>
::reset(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
        *this)

{
  PipeType PVar1;
  size_t sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>
  *this_00;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
  *in_RDI;
  size_t l_2;
  size_t f_1;
  size_t f;
  size_t l_1;
  size_t l;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  size_type in_stack_fffffffffffffeb8;
  size_type __n;
  array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>
  *in_stack_fffffffffffffec0;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  
  in_RDI->_num_tokens = 0;
  for (local_90 = 0;
      sVar2 = num_lines((DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
                         *)0x151cd0), local_90 < sVar2; local_90 = local_90 + 1) {
    pvVar3 = std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::operator[]
                       (&in_RDI->_pipeflows,local_90);
    pvVar3->_pipe = 0;
    pvVar3 = std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::operator[]
                       (&in_RDI->_pipeflows,local_90);
    pvVar3->_line = local_90;
  }
  std::
  vector<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>_>_>
  ::operator[](&in_RDI->_lines,0);
  pvVar4 = std::
           array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>
           ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (pvVar4->join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  for (local_98 = 1;
      sVar2 = num_lines((DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
                         *)0x151e46), local_98 < sVar2; local_98 = local_98 + 1) {
    for (local_a0 = 1; sVar2 = num_pipes(in_RDI), local_a0 < sVar2; local_a0 = local_a0 + 1) {
      std::
      vector<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>_>_>
      ::operator[](&in_RDI->_lines,local_98);
      pvVar4 = std::
               array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>
               ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      pvVar5 = std::
               array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::PipeMeta,_2UL>
               ::operator[]((array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::PipeMeta,_2UL>
                             *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      PVar1 = pvVar5->type;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (pvVar4->join_counter).super___atomic_base<unsigned_long>._M_i = (long)(int)PVar1;
    }
  }
  for (local_a8 = 1; sVar2 = num_pipes(in_RDI), local_a8 < sVar2; local_a8 = local_a8 + 1) {
    std::
    vector<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>_>_>
    ::operator[](&in_RDI->_lines,0);
    pvVar4 = std::
             array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>
             ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (pvVar4->join_counter).super___atomic_base<unsigned_long>._M_i = 1;
  }
  for (local_b0 = 1;
      sVar2 = num_lines((DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>
                         *)0x1520f6), local_b0 < sVar2; local_b0 = local_b0 + 1) {
    std::
    vector<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>_>_>
    ::operator[](&in_RDI->_lines,local_b0);
    __n = 0;
    this_00 = (array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::Line,_2UL>
               *)std::
                 array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::Line,_2UL>
                 ::operator[](in_stack_fffffffffffffec0,0);
    pvVar5 = std::
             array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:293:7)>_>::PipeMeta,_2UL>
             ::operator[]((array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:280:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:293:7)>_>::PipeMeta,_2UL>
                           *)this_00,__n);
    PVar1 = pvVar5->type;
    in_stack_fffffffffffffec0 = this_00;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    this_00->_M_elems[0].join_counter.super___atomic_base<unsigned_long>._M_i =
         (long)(int)PVar1 + -1;
  }
  return;
}

Assistant:

void DataPipeline<Ps...>::reset() {

  _num_tokens = 0;

  for(size_t l = 0; l<num_lines(); l++) {
    _pipeflows[l]._pipe = 0;
    _pipeflows[l]._line = l;
  }

  _lines[0][0].join_counter.store(0, std::memory_order_relaxed);

  for(size_t l=1; l<num_lines(); l++) {
    for(size_t f=1; f<num_pipes(); f++) {
      _lines[l][f].join_counter.store(
        static_cast<size_t>(_meta[f].type), std::memory_order_relaxed
      );
    }
  }

  for(size_t f=1; f<num_pipes(); f++) {
    _lines[0][f].join_counter.store(1, std::memory_order_relaxed);
  }

  for(size_t l=1; l<num_lines(); l++) {
    _lines[l][0].join_counter.store(
      static_cast<size_t>(_meta[0].type) - 1, std::memory_order_relaxed
    );
  }
}